

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallAndroidMKGenerator.cxx
# Opt level: O0

void __thiscall
cmExportInstallAndroidMKGenerator::GenerateImportTargetCode
          (cmExportInstallAndroidMKGenerator *this,ostream *os,cmGeneratorTarget *target,
          TargetType param_3)

{
  cmTarget *this_00;
  bool bVar1;
  ostream *poVar2;
  string *psVar3;
  reference pvVar4;
  string local_140;
  undefined1 local_120 [8];
  string config;
  string local_f8;
  string local_c8;
  cmAlphaNum local_a8;
  cmAlphaNum local_78;
  undefined1 local_48 [8];
  string targetName;
  TargetType param_3_local;
  cmGeneratorTarget *target_local;
  ostream *os_local;
  cmExportInstallAndroidMKGenerator *this_local;
  
  targetName.field_2._12_4_ = param_3;
  cmAlphaNum::cmAlphaNum
            (&local_78,
             &(this->super_cmExportInstallFileGenerator).super_cmExportFileGenerator.Namespace);
  cmGeneratorTarget::GetExportName_abi_cxx11_(&local_c8,target);
  cmAlphaNum::cmAlphaNum(&local_a8,&local_c8);
  cmStrCat<>((string *)local_48,&local_78,&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::operator<<(os,"include $(CLEAR_VARS)\n");
  std::operator<<(os,"LOCAL_MODULE := ");
  poVar2 = std::operator<<(os,(string *)local_48);
  std::operator<<(poVar2,"\n");
  std::operator<<(os,"LOCAL_SRC_FILES := $(_IMPORT_PREFIX)/");
  this_00 = target->Target;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"__dest",(allocator<char> *)(config.field_2._M_local_buf + 0xf));
  psVar3 = cmTarget::GetSafeProperty(this_00,&local_f8);
  poVar2 = std::operator<<(os,(string *)psVar3);
  std::operator<<(poVar2,"/");
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator((allocator<char> *)(config.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string((string *)local_120);
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&(this->super_cmExportInstallFileGenerator).super_cmExportFileGenerator.
                   Configurations);
  if (!bVar1) {
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&(this->super_cmExportInstallFileGenerator).super_cmExportFileGenerator.
                           Configurations,0);
    std::__cxx11::string::operator=((string *)local_120,(string *)pvVar4);
  }
  cmGeneratorTarget::GetFullName(&local_140,target,(string *)local_120,RuntimeBinaryArtifact);
  poVar2 = std::operator<<(os,(string *)&local_140);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)local_120);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void cmExportInstallAndroidMKGenerator::GenerateImportTargetCode(
  std::ostream& os, cmGeneratorTarget const* target,
  cmStateEnums::TargetType /*targetType*/)
{
  std::string targetName = cmStrCat(this->Namespace, target->GetExportName());
  os << "include $(CLEAR_VARS)\n";
  os << "LOCAL_MODULE := ";
  os << targetName << "\n";
  os << "LOCAL_SRC_FILES := $(_IMPORT_PREFIX)/";
  os << target->Target->GetSafeProperty("__dest") << "/";
  std::string config;
  if (!this->Configurations.empty()) {
    config = this->Configurations[0];
  }
  os << target->GetFullName(config) << "\n";
}